

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  _func_void_int_int *p_Var3;
  char *__s1;
  ImGuiWindow **ppIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  byte bVar10;
  ImU32 key;
  ImGuiWindow *pIVar11;
  ImGuiWindow **ppIVar12;
  unsigned_short *__dest;
  char *pcVar13;
  char *label;
  ImGuiContext *g;
  int clip_dir;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ImRect local_48;
  
  pIVar9 = GImGui;
  if (GImGui->Initialized == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x103f,"EndFrame","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (pIVar9->FrameCountEnded == pIVar9->FrameCount) {
    return;
  }
  if (pIVar9->WithinFrameScope == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1044,"EndFrame","ImGui ASSERT FAILED: %s",
                "g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"");
  }
  pIVar8 = GImGui;
  iVar17 = (GImGui->CurrentWindowStack).Size;
  if (iVar17 != 1) {
    if (iVar17 < 2) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1aae,"ErrorCheckEndFrameSanityChecks","ImGui ASSERT FAILED: %s",
                  "(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                 );
    }
    else {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1aa8,"ErrorCheckEndFrameSanityChecks","ImGui ASSERT FAILED: %s",
                  "(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                 );
      iVar17 = (pIVar8->CurrentWindowStack).Size;
      while (1 < iVar17) {
        End();
        iVar17 = (pIVar8->CurrentWindowStack).Size;
      }
    }
  }
  p_Var3 = (pIVar9->IO).ImeSetInputScreenPosFn;
  if (p_Var3 != (_func_void_int_int *)0x0) {
    fVar22 = (pIVar9->PlatformImeLastPos).x;
    if ((fVar22 != 3.4028235e+38) || (NAN(fVar22))) {
      fVar21 = (pIVar9->PlatformImePos).x;
      fVar20 = (pIVar9->PlatformImePos).y;
      fVar23 = (pIVar9->PlatformImeLastPos).y - fVar20;
      if ((fVar22 - fVar21) * (fVar22 - fVar21) + fVar23 * fVar23 <= 0.0001) goto LAB_00209177;
    }
    else {
      fVar21 = (pIVar9->PlatformImePos).x;
      fVar20 = (pIVar9->PlatformImePos).y;
    }
    (*p_Var3)((int)fVar21,(int)fVar20);
    pIVar9->PlatformImeLastPos = pIVar9->PlatformImePos;
  }
LAB_00209177:
  pIVar9->WithinFrameScopeWithImplicitWindow = false;
  pIVar11 = pIVar9->CurrentWindow;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
    pIVar11->Active = false;
  }
  End();
  pIVar8 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar11 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar8->WindowsById,key);
      pIVar8->NavWindowingListWindow = pIVar11;
    }
    IVar2 = (pIVar8->IO).DisplaySize;
    fVar22 = IVar2.x;
    fVar21 = IVar2.y;
    IVar7.y = fVar21 * 0.2;
    IVar7.x = fVar22 * 0.2;
    (pIVar8->NextWindowData).SizeConstraintRect.Min = IVar7;
    (pIVar8->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar8->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar8->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar8->NextWindowData).SizeCallbackUserData = (void *)0x0;
    *(byte *)&(pIVar8->NextWindowData).Flags = (byte)(pIVar8->NextWindowData).Flags | 0x11;
    IVar2.y = fVar21 * 0.5;
    IVar2.x = fVar22 * 0.5;
    (pIVar8->NextWindowData).PosVal = IVar2;
    (pIVar8->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar8->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar8->NextWindowData).PosCond = 1;
    IVar2 = (pIVar8->Style).WindowPadding;
    fVar22 = IVar2.x;
    fVar21 = IVar2.y;
    local_48.Min.y = fVar21 + fVar21;
    local_48.Min.x = fVar22 + fVar22;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar15 = (long)(pIVar8->WindowsFocusOrder).Size;
    if (0 < lVar15) {
      do {
        if ((pIVar8->WindowsFocusOrder).Size < lVar15) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar11 = (pIVar8->WindowsFocusOrder).Data[lVar15 + -1];
        if (((pIVar11->Active == true) && (pIVar11->RootWindow == pIVar11)) &&
           (uVar14 = pIVar11->Flags, (uVar14 >> 0x13 & 1) == 0)) {
          __s1 = pIVar11->Name;
          pcVar13 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00209345:
            label = "(Popup)";
            if ((uVar14 >> 0x1a & 1) == 0) {
              if ((uVar14 >> 10 & 1) != 0) {
                iVar17 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar17 == 0) goto LAB_00209376;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar13 == '#') {
                if (pcVar13[1] == '#') goto LAB_0020933b;
              }
              else if (*pcVar13 == '\0') goto LAB_0020933b;
              pcVar13 = pcVar13 + 1;
            } while (pcVar13 != (char *)0xffffffffffffffff);
            pcVar13 = (char *)0xffffffffffffffff;
LAB_0020933b:
            label = __s1;
            if (__s1 == pcVar13) goto LAB_00209345;
          }
LAB_00209376:
          local_48.Min.x = 0.0;
          local_48.Min.y = 0.0;
          Selectable(label,pIVar8->NavWindowingTarget == pIVar11,0,&local_48.Min);
        }
        bVar6 = 1 < lVar15;
        lVar15 = lVar15 + -1;
      } while (bVar6);
    }
    End();
    PopStyleVar(1);
  }
  pIVar11 = pIVar8->NavWrapRequestWindow;
  if (((((pIVar11 != (ImGuiWindow *)0x0) && (pIVar8->NavWindow == pIVar11)) &&
       ((GImGui->NavMoveRequest == true &&
        (((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)))))) &&
      (pIVar8->NavMoveRequestForward == ImGuiNavForward_None)) &&
     (pIVar8->NavLayer == ImGuiNavLayer_Main)) {
    uVar14 = pIVar8->NavWrapRequestFlags;
    if (uVar14 == 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x22c1,"NavEndFrame","ImGui ASSERT FAILED: %s","move_flags != 0");
    }
    local_48.Min = pIVar11->NavRectRel[0].Min;
    local_48.Max = pIVar11->NavRectRel[0].Max;
    iVar17 = pIVar8->NavMoveDir;
    clip_dir = iVar17;
    if (iVar17 == 0) {
      if ((uVar14 & 5) == 0) goto LAB_0020966c;
      fVar22 = (pIVar11->SizeFull).x;
      fVar21 = (pIVar11->WindowPadding).x;
      fVar21 = fVar21 + fVar21 + (pIVar11->ContentSize).x;
      uVar19 = -(uint)(fVar21 <= fVar22);
      fVar22 = (float)(uVar19 & (uint)fVar22 | ~uVar19 & (uint)fVar21) - (pIVar11->Scroll).x;
      clip_dir = 0;
      if ((uVar14 & 4) != 0) {
        fVar21 = local_48.Max.y - local_48.Min.y;
        local_48.Min.y = local_48.Min.y - fVar21;
        local_48.Max.y = local_48.Max.y - fVar21;
        clip_dir = 2;
      }
      local_48.Max.x = fVar22;
      local_48.Min.x = fVar22;
      NavMoveRequestForward(0,clip_dir,&local_48,uVar14);
      iVar17 = pIVar8->NavMoveDir;
    }
    if (iVar17 == 1 && (uVar14 & 5) != 0) {
      fVar22 = (pIVar11->Scroll).x;
      fVar20 = local_48.Max.y;
      local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar22) ^ 0x80000000);
      fVar21 = local_48.Min.y;
      local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar22) ^ 0x80000000);
      if ((uVar14 & 4) != 0) {
        fVar22 = fVar20 - fVar21;
        local_48.Min.y = fVar21 + fVar22;
        local_48.Max.y = fVar22 + fVar20;
        clip_dir = 3;
      }
      NavMoveRequestForward(1,clip_dir,&local_48,uVar14);
      iVar17 = pIVar8->NavMoveDir;
    }
    if ((uVar14 & 10) != 0 && iVar17 == 2) {
      fVar22 = (pIVar11->SizeFull).y;
      fVar21 = (pIVar11->WindowPadding).y;
      fVar21 = fVar21 + fVar21 + (pIVar11->ContentSize).y;
      uVar19 = -(uint)(fVar21 <= fVar22);
      fVar22 = (float)(uVar19 & (uint)fVar22 | ~uVar19 & (uint)fVar21) - (pIVar11->Scroll).y;
      if ((uVar14 & 8) != 0) {
        fVar21 = local_48.Max.x - local_48.Min.x;
        local_48.Min.x = local_48.Min.x - fVar21;
        local_48.Max.x = local_48.Max.x - fVar21;
        clip_dir = 0;
      }
      local_48.Max.y = fVar22;
      local_48.Min.y = fVar22;
      NavMoveRequestForward(2,clip_dir,&local_48,uVar14);
      iVar17 = pIVar8->NavMoveDir;
    }
    if (iVar17 == 3 && (uVar14 & 10) != 0) {
      fVar22 = (pIVar11->Scroll).y;
      fVar20 = local_48.Max.x;
      local_48.Max = (ImVec2)(CONCAT44(fVar22,local_48.Max.x) ^ 0x8000000000000000);
      fVar21 = local_48.Min.x;
      local_48.Min = (ImVec2)(CONCAT44(fVar22,local_48.Min.x) ^ 0x8000000000000000);
      if ((uVar14 & 8) != 0) {
        fVar22 = fVar20 - fVar21;
        local_48.Min.x = fVar21 + fVar22;
        local_48.Max.x = fVar22 + fVar20;
        clip_dir = 1;
      }
      NavMoveRequestForward(3,clip_dir,&local_48,uVar14);
    }
  }
LAB_0020966c:
  pIVar8 = GImGui;
  if (pIVar9->DragDropActive != true) goto LAB_002096eb;
  bVar6 = (pIVar9->DragDropPayload).Delivery;
  if ((pIVar9->DragDropPayload).DataFrameCount + 1 < pIVar9->FrameCount) {
    if ((pIVar9->DragDropSourceFlags & 0x20) == 0) {
      iVar17 = pIVar9->DragDropMouseButton;
      if (4 < (ulong)(long)iVar17) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x1159,"IsMouseDown","ImGui ASSERT FAILED: %s",
                    "button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown)");
      }
      bVar10 = (pIVar8->IO).MouseDown[iVar17] ^ 1;
      goto LAB_002096de;
    }
  }
  else {
    bVar10 = 0;
LAB_002096de:
    if ((bVar10 == 0) && (bVar6 == false)) goto LAB_002096eb;
  }
  ClearDragDrop();
LAB_002096eb:
  iVar17 = pIVar9->FrameCount;
  if (((pIVar9->DragDropActive == true) && (pIVar9->DragDropSourceFrameCount < iVar17)) &&
     ((pIVar9->DragDropSourceFlags & 1) == 0)) {
    pIVar9->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar9->DragDropWithinSource = false;
    iVar17 = pIVar9->FrameCount;
  }
  pIVar9->WithinFrameScope = false;
  pIVar9->FrameCountEnded = iVar17;
  UpdateMouseMovingWindowEndFrame();
  iVar17 = (pIVar9->WindowsTempSortBuffer).Capacity;
  if (iVar17 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    iVar17 = 0;
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar4,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
      ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
      if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    }
    (pIVar9->WindowsTempSortBuffer).Data = ppIVar12;
    (pIVar9->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar9->WindowsTempSortBuffer).Size = 0;
  uVar14 = (pIVar9->Windows).Size;
  uVar16 = (ulong)uVar14;
  if (iVar17 < (int)uVar14) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar16 * 8,GImAllocatorUserData);
    ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar4,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
      ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
      if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    }
    (pIVar9->WindowsTempSortBuffer).Data = ppIVar12;
    (pIVar9->WindowsTempSortBuffer).Capacity = uVar14;
    uVar16 = (ulong)(uint)(pIVar9->Windows).Size;
  }
  if ((int)uVar16 == 0) {
    uVar14 = 0;
  }
  else {
    uVar18 = 0;
    do {
      if ((long)(int)uVar16 <= (long)uVar18) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar11 = (pIVar9->Windows).Data[uVar18];
      if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar9->WindowsTempSortBuffer,pIVar11);
      }
      uVar18 = uVar18 + 1;
      uVar14 = (pIVar9->Windows).Size;
      uVar16 = (ulong)uVar14;
    } while (uVar18 != uVar16);
  }
  uVar19 = uVar14;
  if (uVar14 != (pIVar9->WindowsTempSortBuffer).Size) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x107d,"EndFrame","ImGui ASSERT FAILED: %s",
                "g.Windows.Size == g.WindowsTempSortBuffer.Size");
    uVar14 = (pIVar9->Windows).Size;
    uVar19 = (pIVar9->WindowsTempSortBuffer).Size;
  }
  (pIVar9->WindowsTempSortBuffer).Size = uVar14;
  (pIVar9->Windows).Size = uVar19;
  iVar17 = (pIVar9->WindowsTempSortBuffer).Capacity;
  (pIVar9->WindowsTempSortBuffer).Capacity = (pIVar9->Windows).Capacity;
  (pIVar9->Windows).Capacity = iVar17;
  ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
  (pIVar9->WindowsTempSortBuffer).Data = (pIVar9->Windows).Data;
  (pIVar9->Windows).Data = ppIVar4;
  (pIVar9->IO).MetricsActiveWindows = pIVar9->WindowsActiveCount;
  ((pIVar9->IO).Fonts)->Locked = false;
  (pIVar9->IO).MouseWheel = 0.0;
  (pIVar9->IO).MouseWheelH = 0.0;
  if ((pIVar9->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
    if (puVar5 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar5,(long)(pIVar9->IO).InputQueueCharacters.Size * 2);
      puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
      if ((puVar5 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
    }
    (pIVar9->IO).InputQueueCharacters.Data = __dest;
    (pIVar9->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar9->IO).InputQueueCharacters.Size = 0;
  (pIVar9->IO).NavInputs[0] = 0.0;
  (pIVar9->IO).NavInputs[1] = 0.0;
  (pIVar9->IO).NavInputs[2] = 0.0;
  (pIVar9->IO).NavInputs[3] = 0.0;
  (pIVar9->IO).NavInputs[4] = 0.0;
  (pIVar9->IO).NavInputs[5] = 0.0;
  (pIVar9->IO).NavInputs[6] = 0.0;
  (pIVar9->IO).NavInputs[7] = 0.0;
  (pIVar9->IO).NavInputs[8] = 0.0;
  (pIVar9->IO).NavInputs[9] = 0.0;
  (pIVar9->IO).NavInputs[10] = 0.0;
  (pIVar9->IO).NavInputs[0xb] = 0.0;
  (pIVar9->IO).NavInputs[0xc] = 0.0;
  (pIVar9->IO).NavInputs[0xd] = 0.0;
  (pIVar9->IO).NavInputs[0xe] = 0.0;
  (pIVar9->IO).NavInputs[0xf] = 0.0;
  (pIVar9->IO).NavInputs[0x10] = 0.0;
  (pIVar9->IO).NavInputs[0x11] = 0.0;
  (pIVar9->IO).NavInputs[0x12] = 0.0;
  (pIVar9->IO).NavInputs[0x13] = 0.0;
  (pIVar9->IO).NavInputs[0x14] = 0.0;
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}